

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::attributeDecl(Parser *this,ptr<ObjectExpression> *descriptor,Scope scope)

{
  undefined4 scope_00;
  bool bVar1;
  element_type *this_00;
  shared_ptr<Expression> local_a8;
  undefined1 local_98 [8];
  ptr<Expression> expr;
  Token local_78;
  undefined1 local_40 [8];
  Identifier identifier;
  bool constant;
  Scope scope_local;
  ptr<ObjectExpression> *descriptor_local;
  Parser *this_local;
  
  identifier.field_2._M_local_buf[0xb] = '\x01';
  identifier.field_2._12_4_ = scope;
  bVar1 = match(this,Let);
  if (bVar1) {
    consume(this);
  }
  else {
    bVar1 = match(this,Const);
    if (bVar1) {
      identifier.field_2._M_local_buf[0xb] = '\0';
      consume(this);
    }
  }
  token(&local_78,this);
  std::__cxx11::string::string((string *)local_40,(string *)&local_78.lexeme);
  Token::~Token(&local_78);
  consume(this,Identifier,"identifier");
  consume(this,Assign,"assignment operator \'=\'");
  expression((Parser *)local_98);
  consume(this,StatEnd,"\';\'");
  this_00 = std::__shared_ptr_access<ObjectExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ObjectExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)descriptor);
  scope_00 = identifier.field_2._12_4_;
  std::shared_ptr<Expression>::shared_ptr(&local_a8,(shared_ptr<Expression> *)local_98);
  ObjectExpression::putExpression
            (this_00,(Identifier *)local_40,scope_00,&local_a8,
             (bool)(identifier.field_2._M_local_buf[0xb] & 1));
  std::shared_ptr<Expression>::~shared_ptr(&local_a8);
  std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Parser::attributeDecl(ptr<ObjectExpression> &descriptor, Scope scope) {
    bool constant = true;

    if(match(TokenType::Let)) {
        consume();
    } else if(match(TokenType::Const)) {
        constant = false;
        consume();
    }

    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier,"identifier");
    consume(TokenType::Assign, "assignment operator '='");
    ptr<Expression> expr = expression();
    consume(TokenType::StatEnd, "';'");

    descriptor -> putExpression(identifier, scope, expr, constant);
}